

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

ArgIface * __thiscall Args::GroupIface::findArgument(GroupIface *this,String *name)

{
  long lVar1;
  ArgIface *pAVar2;
  long lVar3;
  
  lVar3 = *(long *)(this + 0x10);
  lVar1 = *(long *)(this + 0x18);
  do {
    if (lVar3 == lVar1) {
      return (ArgIface *)0x0;
    }
    pAVar2 = (ArgIface *)(**(code **)(**(long **)(lVar3 + 8) + 0x70))(*(long **)(lVar3 + 8),name);
    lVar3 = lVar3 + 0x10;
  } while (pAVar2 == (ArgIface *)0x0);
  return pAVar2;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		for( const auto & arg : details::asConst( m_children ) )
		{
			ArgIface * tmp = arg->findArgument( name );

			if( tmp != nullptr )
				return tmp;
		}

		return nullptr;
	}